

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

char * __thiscall
ImFont::CalcWordWrapPositionA(ImFont *this,float scale,char *text,char *text_end,float wrap_width)

{
  bool bVar1;
  int iVar2;
  char *local_90;
  bool local_85;
  float local_84;
  char *pcStack_68;
  float char_width;
  char *next_s;
  char *pcStack_58;
  uint c;
  char *s;
  char *pcStack_48;
  bool inside_word;
  char *prev_word_end;
  char *word_end;
  float blank_width;
  float word_width;
  float line_width;
  float wrap_width_local;
  char *text_end_local;
  char *text_local;
  ImFont *pIStack_10;
  float scale_local;
  ImFont *this_local;
  
  blank_width = 0.0;
  word_end._4_4_ = 0.0;
  word_end._0_4_ = 0.0;
  word_width = wrap_width / scale;
  pcStack_48 = (char *)0x0;
  s._7_1_ = 1;
  pcStack_58 = text;
  prev_word_end = text;
  _line_width = text_end;
  text_end_local = text;
  text_local._4_4_ = scale;
  pIStack_10 = this;
  do {
    while( true ) {
      pcStack_68 = pcStack_58;
      if (_line_width <= pcStack_58) {
        return pcStack_58;
      }
      next_s._4_4_ = (uint)*pcStack_58;
      if (next_s._4_4_ < 0x80) {
        pcStack_68 = pcStack_58 + 1;
      }
      else {
        iVar2 = ImTextCharFromUtf8((uint *)((long)&next_s + 4),pcStack_58,_line_width);
        pcStack_68 = pcStack_68 + iVar2;
      }
      if (next_s._4_4_ == 0) {
        return pcStack_58;
      }
      if (next_s._4_4_ < 0x20) break;
LAB_001ed52d:
      if ((int)next_s._4_4_ < (this->IndexAdvanceX).Size) {
        local_84 = (this->IndexAdvanceX).Data[next_s._4_4_];
      }
      else {
        local_84 = this->FallbackAdvanceX;
      }
      bVar1 = ImCharIsBlankW(next_s._4_4_);
      if (bVar1) {
        if ((s._7_1_ & 1) != 0) {
          blank_width = word_end._0_4_ + blank_width;
          word_end._0_4_ = 0.0;
          prev_word_end = pcStack_58;
        }
        word_end._0_4_ = local_84 + word_end._0_4_;
        s._7_1_ = false;
      }
      else {
        word_end._4_4_ = local_84 + word_end._4_4_;
        if ((s._7_1_ & 1) == 0) {
          pcStack_48 = prev_word_end;
          blank_width = word_end._4_4_ + word_end._0_4_ + blank_width;
          word_end._0_4_ = 0.0;
          word_end._4_4_ = 0.0;
        }
        else {
          prev_word_end = pcStack_68;
        }
        local_85 = false;
        if ((((next_s._4_4_ != 0x2e) && (local_85 = false, next_s._4_4_ != 0x2c)) &&
            (local_85 = false, next_s._4_4_ != 0x3b)) &&
           ((local_85 = false, next_s._4_4_ != 0x21 && (local_85 = false, next_s._4_4_ != 0x3f)))) {
          local_85 = next_s._4_4_ != 0x22;
        }
        s._7_1_ = local_85;
      }
      if (word_width < blank_width + word_end._4_4_) {
        if (word_width <= word_end._4_4_) {
          return pcStack_58;
        }
        if (pcStack_48 == (char *)0x0) {
          local_90 = prev_word_end;
        }
        else {
          local_90 = pcStack_48;
        }
        return local_90;
      }
      pcStack_58 = pcStack_68;
    }
    if (next_s._4_4_ == 10) {
      word_end._0_4_ = 0.0;
      word_end._4_4_ = 0.0;
      blank_width = 0.0;
      s._7_1_ = 1;
      pcStack_58 = pcStack_68;
    }
    else {
      if (next_s._4_4_ != 0xd) goto LAB_001ed52d;
      pcStack_58 = pcStack_68;
    }
  } while( true );
}

Assistant:

const char* ImFont::CalcWordWrapPositionA(float scale, const char* text, const char* text_end, float wrap_width) const
{
    // Simple word-wrapping for English, not full-featured. Please submit failing cases!
    // FIXME: Much possible improvements (don't cut things like "word !", "word!!!" but cut within "word,,,,", more sensible support for punctuations, support for Unicode punctuations, etc.)

    // For references, possible wrap point marked with ^
    //  "aaa bbb, ccc,ddd. eee   fff. ggg!"
    //      ^    ^    ^   ^   ^__    ^    ^

    // List of hardcoded separators: .,;!?'"

    // Skip extra blanks after a line returns (that includes not counting them in width computation)
    // e.g. "Hello    world" --> "Hello" "World"

    // Cut words that cannot possibly fit within one line.
    // e.g.: "The tropical fish" with ~5 characters worth of width --> "The tr" "opical" "fish"

    float line_width = 0.0f;
    float word_width = 0.0f;
    float blank_width = 0.0f;
    wrap_width /= scale; // We work with unscaled widths to avoid scaling every characters

    const char* word_end = text;
    const char* prev_word_end = NULL;
    bool inside_word = true;

    const char* s = text;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)*s;
        const char* next_s;
        if (c < 0x80)
            next_s = s + 1;
        else
            next_s = s + ImTextCharFromUtf8(&c, s, text_end);
        if (c == 0)
            break;

        if (c < 32)
        {
            if (c == '\n')
            {
                line_width = word_width = blank_width = 0.0f;
                inside_word = true;
                s = next_s;
                continue;
            }
            if (c == '\r')
            {
                s = next_s;
                continue;
            }
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX);
        if (ImCharIsBlankW(c))
        {
            if (inside_word)
            {
                line_width += blank_width;
                blank_width = 0.0f;
                word_end = s;
            }
            blank_width += char_width;
            inside_word = false;
        }
        else
        {
            word_width += char_width;
            if (inside_word)
            {
                word_end = next_s;
            }
            else
            {
                prev_word_end = word_end;
                line_width += word_width + blank_width;
                word_width = blank_width = 0.0f;
            }

            // Allow wrapping after punctuation.
            inside_word = (c != '.' && c != ',' && c != ';' && c != '!' && c != '?' && c != '\"');
        }

        // We ignore blank width at the end of the line (they can be skipped)
        if (line_width + word_width > wrap_width)
        {
            // Words that cannot possibly fit within an entire line will be cut anywhere.
            if (word_width < wrap_width)
                s = prev_word_end ? prev_word_end : word_end;
            break;
        }

        s = next_s;
    }

    return s;
}